

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O1

add_node_status_t
libtorrent::dht::replace_node_impl
          (node_entry *e,bucket_t *b,ip_set *ips,int bucket_index,int bucket_size_limit,
          bool last_bucket,dht_logger *log)

{
  pointer *pp_Var1;
  bool bVar2;
  ushort uVar3;
  pointer pnVar4;
  iterator __position;
  pointer p_Var5;
  pointer p_Var6;
  long lVar7;
  void *pvVar8;
  rep rVar9;
  rep rVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  pointer p_Var16;
  ip_set *this;
  pointer p_Var17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  __result;
  node_entry *pnVar22;
  node_entry *pnVar23;
  pointer pnVar24;
  difference_type extraout_RDX;
  difference_type extraout_RDX_00;
  difference_type extraout_RDX_01;
  difference_type dVar25;
  difference_type extraout_RDX_02;
  difference_type extraout_RDX_03;
  add_node_status_t aVar26;
  int iVar27;
  int n;
  byte bVar28;
  pointer p_Var29;
  node_entry *pnVar30;
  node_entry *pnVar31;
  byte bVar32;
  pointer pnVar33;
  char *pcVar34;
  long lVar35;
  span<const_unsigned_int> buf;
  span<const_unsigned_int> buf_00;
  span<const_unsigned_int> buf_01;
  span<const_unsigned_int> buf_02;
  span<const_char> in;
  __normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>
  local_d50;
  vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
  replace_candidates;
  int local_cfc;
  ulong local_cf8;
  undefined8 local_cf0;
  char *local_ce8;
  ip_set *local_ce0;
  long local_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  string local_cb8;
  uint local_c98 [2];
  uint auStack_c90 [2];
  uint local_c88;
  digest32<160L> local_c78;
  pointer local_c58;
  pointer p_Stack_c50;
  uint local_c48;
  long lStack_c40;
  array<std::vector<bucket_t::iterator>,_128> nodes_storage;
  address *addr;
  
  local_d50._M_current =
       (b->super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
       super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (b->
           super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>).
           super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar24 = local_d50._M_current + 1;
  if (pnVar24 != pnVar4 && local_d50._M_current != pnVar4) {
    do {
      bVar28 = 0;
      if ((local_d50._M_current)->timeout_count != 0xff) {
        bVar28 = (local_d50._M_current)->timeout_count;
      }
      pnVar33 = pnVar24;
      if (pnVar24->timeout_count <= bVar28) {
        pnVar33 = local_d50._M_current;
      }
      if (pnVar24->timeout_count != 0xff) {
        local_d50._M_current = pnVar33;
      }
      pnVar24 = pnVar24 + 1;
    } while (pnVar24 != pnVar4);
  }
  if ((byte)((local_d50._M_current)->timeout_count + 1) < 2) {
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(nodes_storage.
                           super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                           ._M_elems[0].
                           super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           (e->id).m_number._M_elems[4]);
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(e->id).m_number._M_elems;
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[0].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)((e->id).m_number._M_elems + 2);
    iVar27 = bucket_size_limit + -1;
    replace_candidates.
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(replace_candidates.
                           super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar27);
    buf.m_len = (difference_type)&nodes_storage;
    buf.m_ptr = (uint *)0x1;
    local_ce0 = ips;
    iVar18 = aux::count_leading_zeros((aux *)&replace_candidates,buf);
    n = (uint)!last_bucket + bucket_index;
    digest32<160L>::operator<<=((digest32<160L> *)&nodes_storage,n);
    uVar19 = ((uint)(byte)nodes_storage.
                          super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                          ._M_elems[0].
                          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start &
             iVar27 << ((byte)iVar18 & 0x1f)) >> ((byte)iVar18 & 0x1f);
    memset(&nodes_storage,0,0xc00);
    local_d50._M_current =
         (b->super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
         ).
         super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pnVar22 = (b->
              super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
              ).
              super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_d50._M_current != pnVar22) {
      dVar25 = extraout_RDX;
      do {
        local_c48 = ((local_d50._M_current)->id).m_number._M_elems[4];
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)((local_d50._M_current)->id).m_number._M_elems;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)(((local_d50._M_current)->id).m_number._M_elems + 2);
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(replace_candidates.
                               super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,local_c48);
        buf_00.m_len = dVar25;
        buf_00.m_ptr = (uint *)0x1;
        local_cb8._M_dataplus._M_p._0_4_ = iVar27;
        local_c58 = replace_candidates.
                    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        p_Stack_c50 = replace_candidates.
                      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        iVar18 = aux::count_leading_zeros((aux *)&local_cb8,buf_00);
        digest32<160L>::operator<<=((digest32<160L> *)&replace_candidates,n);
        uVar20 = ((uint)(byte)replace_candidates.
                              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start &
                 iVar27 << ((byte)iVar18 & 0x1f)) >> ((byte)iVar18 & 0x1f);
        __position._M_current =
             nodes_storage.
             super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
             ._M_elems[uVar20].
             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            nodes_storage.
            super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
            ._M_elems[uVar20].
            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
          ::
          _M_realloc_insert<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const&>
                    ((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                      *)&nodes_storage.
                         super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                         ._M_elems[uVar20].
                         super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                     ,__position,&local_d50);
          dVar25 = extraout_RDX_01;
        }
        else {
          (__position._M_current)->_M_current = local_d50._M_current;
          pp_Var1 = &nodes_storage.
                     super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                     ._M_elems[uVar20].
                     super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pp_Var1 = *pp_Var1 + 1;
          dVar25 = extraout_RDX_00;
        }
        local_d50._M_current = local_d50._M_current + 1;
        pnVar22 = (b->
                  super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  ).
                  super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (local_d50._M_current != pnVar22);
    }
    this = local_ce0;
    p_Var5 = nodes_storage.
             super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
             ._M_elems[uVar19].
             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var6 = nodes_storage.
             super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
             ._M_elems[uVar19].
             super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var17 = p_Var5;
    if (p_Var5 == p_Var6) {
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      replace_candidates.
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bucket_size_limit != 0) {
        lVar35 = 0;
        do {
          if (8 < (ulong)(*(long *)((long)&nodes_storage.
                                           super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                                           ._M_elems[0].
                                           super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + lVar35) -
                         *(long *)((long)&nodes_storage.
                                          super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
                                          ._M_elems[0].
                                          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar35))) {
            ::std::
            vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>const*,std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>>>
                      ((vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>>>
                        *)&replace_candidates,
                       replace_candidates.
                       super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          lVar35 = lVar35 + 0x18;
        } while ((long)bucket_size_limit * 0x18 != lVar35);
      }
      pnVar23 = (node_entry *)
                (replace_candidates.
                 super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      pnVar22 = (node_entry *)
                replace_candidates.
                super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar31 = (node_entry *)
                replace_candidates.
                super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar23 !=
          (node_entry *)
          replace_candidates.
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish &&
          replace_candidates.
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          replace_candidates.
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          lVar35 = (pnVar22->first_seen).__d.__r;
          lVar7 = (pnVar23->first_seen).__d.__r;
          bVar28 = *(byte *)(lVar35 + 0x3b) ^ 1;
          bVar32 = *(byte *)(lVar7 + 0x3b) ^ 1;
          pnVar31 = pnVar23;
          if (bVar32 <= bVar28) {
            pnVar30 = pnVar23;
            if (*(ushort *)(lVar7 + 0x38) <= *(ushort *)(lVar35 + 0x38)) {
              pnVar30 = pnVar22;
            }
            pnVar31 = pnVar22;
            if (bVar28 <= bVar32) {
              pnVar31 = pnVar30;
            }
          }
          pnVar23 = (node_entry *)&pnVar23->last_queried;
          pnVar22 = pnVar31;
        } while (pnVar23 !=
                 (node_entry *)
                 replace_candidates.
                 super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_d50._M_current = (node_entry *)(pnVar31->first_seen).__d.__r;
      if (replace_candidates.
          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(replace_candidates.
                        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)replace_candidates.
                              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)replace_candidates.
                              super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      while (p_Var16 = p_Var17, p_Var5 = p_Var5 + 1, p_Var5 != p_Var6) {
        bVar28 = p_Var16->_M_current->verified ^ 1;
        bVar32 = p_Var5->_M_current->verified ^ 1;
        p_Var17 = p_Var5;
        if (bVar32 <= bVar28) {
          p_Var29 = p_Var5;
          if (p_Var5->_M_current->rtt <= p_Var16->_M_current->rtt) {
            p_Var29 = p_Var16;
          }
          p_Var17 = p_Var16;
          if (bVar28 <= bVar32) {
            p_Var17 = p_Var29;
          }
        }
      }
      local_d50._M_current = p_Var16->_M_current;
      bVar28 = e->verified ^ 1;
      bVar32 = (local_d50._M_current)->verified ^ 1;
      pnVar23 = local_d50._M_current;
      if ((bVar32 <= bVar28) &&
         ((bVar32 < bVar28 ||
          (pnVar23 = (node_entry *)(ulong)(local_d50._M_current)->rtt,
          (local_d50._M_current)->rtt <= e->rtt)))) {
        local_d50._M_current = pnVar22;
      }
    }
    if (local_d50._M_current ==
        (b->super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>)
        .
        super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      aVar26 = need_bucket_split;
    }
    else {
      if ((log != (dht_logger *)0x0) &&
         (iVar18 = (**log->_vptr_dht_logger)(log,2), (char)iVar18 != '\0')) {
        in.m_len = (difference_type)pnVar23;
        in.m_ptr = (char *)0x14;
        aux::to_hex_abi_cxx11_((string *)&replace_candidates,(aux *)&e->id,in);
        p_Var5 = replace_candidates.
                 super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((e->endpoint).addr.field_0x10 & 1) == 0) {
          local_cd0 = *(undefined8 *)&(e->endpoint).addr.addr;
          uStack_cc8 = *(undefined8 *)((long)&(e->endpoint).addr.addr + 8);
          local_cd8 = 1;
        }
        else {
          local_cd8 = (ulong)*(uint *)(e->endpoint).addr.addr.v4._M_elems << 0x20;
          local_cd0 = 0;
          uStack_cc8 = 0;
        }
        local_cc0 = 0;
        aux::print_address_abi_cxx11_(&local_cb8,(aux *)&local_cd8,addr);
        pcVar34 = "not-verified";
        local_ce8 = "not-verified";
        if (e->verified != false) {
          local_ce8 = "verified";
        }
        local_cf0 = CONCAT44(local_cb8._M_dataplus._M_p._4_4_,(int)local_cb8._M_dataplus._M_p);
        uVar3 = e->rtt;
        local_c78.m_number._M_elems[4] = (e->id).m_number._M_elems[4];
        local_c78.m_number._M_elems._0_8_ = *(undefined8 *)(e->id).m_number._M_elems;
        local_c78.m_number._M_elems._8_8_ = *(undefined8 *)((e->id).m_number._M_elems + 2);
        buf_01.m_len = extraout_RDX_02;
        buf_01.m_ptr = (uint *)0x1;
        local_cfc = iVar27;
        iVar18 = aux::count_leading_zeros((aux *)&local_cfc,buf_01);
        digest32<160L>::operator<<=(&local_c78,n);
        uVar19 = (uint)(byte)local_c78.m_number._M_elems[0];
        bVar2 = (local_d50._M_current)->verified;
        local_cf8 = (ulong)(local_d50._M_current)->rtt;
        local_c88 = ((local_d50._M_current)->id).m_number._M_elems[4];
        local_c98 = *(uint (*) [2])((local_d50._M_current)->id).m_number._M_elems;
        auStack_c90 = *(uint (*) [2])(((local_d50._M_current)->id).m_number._M_elems + 2);
        buf_02.m_len = extraout_RDX_03;
        buf_02.m_ptr = (uint *)0x1;
        local_cfc = iVar27;
        local_c78.m_number._M_elems._0_8_ = local_c98;
        local_c78.m_number._M_elems._8_8_ = auStack_c90;
        local_c78.m_number._M_elems[4] = local_c88;
        iVar21 = aux::count_leading_zeros((aux *)&local_cfc,buf_02);
        digest32<160L>::operator<<=(&local_c78,n);
        if (bVar2 != false) {
          pcVar34 = "verified";
        }
        (*log->_vptr_dht_logger[1])
                  (log,2,"replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]",
                   p_Var5,local_cf0,local_ce8,(ulong)uVar3,
                   (ulong)((iVar27 << ((byte)iVar18 & 0x1f) & uVar19) >> ((byte)iVar18 & 0x1f)),
                   pcVar34,local_cf8,
                   (ulong)(((uint)(byte)local_c78.m_number._M_elems[0] &
                           iVar27 << ((byte)iVar21 & 0x1f)) >> ((byte)iVar21 & 0x1f)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_cb8._M_dataplus._M_p._4_4_,(int)local_cb8._M_dataplus._M_p) !=
            &local_cb8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_cb8._M_dataplus._M_p._4_4_,(int)local_cb8._M_dataplus._M_p)
                          ,local_cb8.field_2._M_allocated_capacity + 1);
        }
        if (replace_candidates.
            super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&replace_candidates.
                      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(replace_candidates.
                          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(replace_candidates.
                                          super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_current + 1));
        }
      }
      if ((((local_d50._M_current)->endpoint).addr.field_0x10 & 1) == 0) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)&((local_d50._M_current)->endpoint).addr.addr;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&((local_d50._M_current)->endpoint).addr.addr + 8);
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      }
      else {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)*(uint *)((local_d50._M_current)->endpoint).addr.addr.v4._M_elems <<
                      0x20);
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      ip_set::erase(this,(address *)&replace_candidates);
      rVar9 = (e->first_seen).__d.__r;
      rVar10 = (e->last_queried).__d.__r;
      uVar11 = *(undefined8 *)(e->id).m_number._M_elems;
      uVar12 = *(undefined8 *)((e->id).m_number._M_elems + 2);
      uVar13 = *(undefined8 *)((e->id).m_number._M_elems + 4);
      uVar14 = *(undefined8 *)((long)&(e->endpoint).addr.addr + 4);
      uVar15 = *(undefined8 *)&(e->endpoint).addr.field_0x10;
      *(undefined8 *)((long)&((local_d50._M_current)->endpoint).addr.addr + 8) =
           *(undefined8 *)((long)&(e->endpoint).addr.addr + 8);
      *(undefined8 *)&((local_d50._M_current)->endpoint).addr.field_0x10 = uVar15;
      *(undefined8 *)(((local_d50._M_current)->id).m_number._M_elems + 4) = uVar13;
      *(undefined8 *)((long)&((local_d50._M_current)->endpoint).addr.addr + 4) = uVar14;
      *(undefined8 *)((local_d50._M_current)->id).m_number._M_elems = uVar11;
      *(undefined8 *)(((local_d50._M_current)->id).m_number._M_elems + 2) = uVar12;
      ((local_d50._M_current)->first_seen).__d.__r = rVar9;
      ((local_d50._M_current)->last_queried).__d.__r = rVar10;
      if (((e->endpoint).addr.field_0x10 & 1) == 0) {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(e->endpoint).addr.addr;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&(e->endpoint).addr.addr + 8);
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
      }
      else {
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)*(uint *)(e->endpoint).addr.addr.v4._M_elems << 0x20);
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        replace_candidates.
        super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      ip_set::insert(this,(address *)&replace_candidates);
      aVar26 = node_added;
    }
    lVar35 = 0xc00;
    do {
      pvVar8 = *(void **)((long)&p_Stack_c50 + lVar35);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,*(long *)((long)&lStack_c40 + lVar35) - (long)pvVar8);
      }
      lVar35 = lVar35 + -0x18;
    } while (lVar35 != 0);
  }
  else {
    if ((((local_d50._M_current)->endpoint).addr.field_0x10 & 1) == 0) {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)&((local_d50._M_current)->endpoint).addr.addr;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&((local_d50._M_current)->endpoint).addr.addr + 8);
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    }
    else {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)*(uint *)((local_d50._M_current)->endpoint).addr.addr.v4._M_elems <<
                    0x20);
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[1].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ip_set::erase(ips,(address *)&nodes_storage);
    rVar9 = (e->first_seen).__d.__r;
    rVar10 = (e->last_queried).__d.__r;
    uVar11 = *(undefined8 *)(e->id).m_number._M_elems;
    uVar12 = *(undefined8 *)((e->id).m_number._M_elems + 2);
    uVar13 = *(undefined8 *)((e->id).m_number._M_elems + 4);
    uVar14 = *(undefined8 *)((long)&(e->endpoint).addr.addr + 4);
    uVar15 = *(undefined8 *)&(e->endpoint).addr.field_0x10;
    *(undefined8 *)((long)&((local_d50._M_current)->endpoint).addr.addr + 8) =
         *(undefined8 *)((long)&(e->endpoint).addr.addr + 8);
    *(undefined8 *)&((local_d50._M_current)->endpoint).addr.field_0x10 = uVar15;
    *(undefined8 *)(((local_d50._M_current)->id).m_number._M_elems + 4) = uVar13;
    *(undefined8 *)((long)&((local_d50._M_current)->endpoint).addr.addr + 4) = uVar14;
    *(undefined8 *)((local_d50._M_current)->id).m_number._M_elems = uVar11;
    *(undefined8 *)(((local_d50._M_current)->id).m_number._M_elems + 2) = uVar12;
    ((local_d50._M_current)->first_seen).__d.__r = rVar9;
    ((local_d50._M_current)->last_queried).__d.__r = rVar10;
    if (((e->endpoint).addr.field_0x10 & 1) == 0) {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&(e->endpoint).addr.addr;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)&(e->endpoint).addr.addr + 8);
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    }
    else {
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)*(uint *)(e->endpoint).addr.addr.v4._M_elems << 0x20);
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nodes_storage.
      super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
      ._M_elems[0].
      super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    nodes_storage.
    super_array<std::vector<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>,_128UL>
    ._M_elems[1].
    super__Vector_base<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_*,_std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ip_set::insert(ips,(address *)&nodes_storage);
    aVar26 = node_added;
  }
  return aVar26;
}

Assistant:

routing_table::add_node_status_t replace_node_impl(node_entry const& e
	, bucket_t& b, ip_set& ips, int const bucket_index
	, int const bucket_size_limit, bool const last_bucket
#ifndef TORRENT_DISABLE_LOGGING
	, dht_logger* log
#endif
	)
{
	// if the bucket isn't full, we're not replacing anything, and this function
	// should not have been called
	TORRENT_ASSERT(int(b.size()) >= bucket_size_limit);

	auto j = std::max_element(b.begin(), b.end()
		, [](node_entry const& lhs, node_entry const& rhs)
		{ return lhs.fail_count() < rhs.fail_count(); });
	TORRENT_ASSERT(j != b.end());

	if (j->fail_count() > 0)
	{
		// i points to a node that has been marked
		// as stale. Replace it with this new one
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}

	// then we look for nodes with the same 3 bit prefix (or however
	// many bits prefix the bucket size warrants). If there is no other
	// node with this prefix, remove the duplicate with the highest RTT.
	// as the last replacement strategy, if the node we found matching our
	// bit prefix has higher RTT than the new node, replace it.

	// in order to provide as few lookups as possible before finding
	// the data someone is looking for, make sure there is an affinity
	// towards having a good spread of node IDs in each bucket
	std::uint8_t const to_add_prefix = classify_prefix(bucket_index
		, last_bucket, bucket_size_limit, e.id);

	// nodes organized by their prefix
	aux::array<std::vector<bucket_t::iterator>, 128> nodes_storage;
	auto const nodes = span<std::vector<bucket_t::iterator>>{nodes_storage}.first(bucket_size_limit);

	for (j = b.begin(); j != b.end(); ++j)
	{
		std::uint8_t const prefix = classify_prefix(
			bucket_index, last_bucket, bucket_size_limit, j->id);
		TORRENT_ASSERT(prefix < nodes.size());
		nodes[prefix].push_back(j);
	}

	if (!nodes[to_add_prefix].empty())
	{
		j = *std::max_element(nodes[to_add_prefix].begin(), nodes[to_add_prefix].end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });

		// only if e is better than the worst node in this prefix slot do we
		// replace it. resetting j means we're not replacing it
		if (!(e < *j)) j = b.end();
	}
	else
	{
		// there is no node in this prefix slot. We definitely want to add it.
		// Now we just need to figure out which one to replace
		std::vector<bucket_t::iterator> replace_candidates;
		for (auto const& n : nodes)
		{
			if (n.size() > 1) replace_candidates.insert(replace_candidates.end(), n.begin(), n.end());
		}

		// since the bucket is full, and there's no node in the prefix-slot
		// we're about to add to, there must be at least one prefix slot that
		// has more than one node.
		TORRENT_ASSERT(!replace_candidates.empty());

		// from these nodes, pick the "worst" one and replace it
		j = *std::max_element(replace_candidates.begin(), replace_candidates.end()
			, [](bucket_t::iterator lhs, bucket_t::iterator rhs)
			{ return *lhs < *rhs; });
	}

	if (j != b.end())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (log != nullptr && log->should_log(dht_logger::routing_table))
		{
			log->log(dht_logger::routing_table, "replacing node with better one: %s %s [%s %dms %d] vs. [%s %dms %d]"
				, aux::to_hex(e.id).c_str(), aux::print_address(e.addr()).c_str()
				, e.verified ? "verified" : "not-verified", e.rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, e.id)
				, j->verified ? "verified" : "not-verified", j->rtt
				, classify_prefix(bucket_index, last_bucket, bucket_size_limit, j->id)
				);
		}
#endif
		ips.erase(j->addr());
		*j = e;
		ips.insert(e.addr());
		return routing_table::node_added;
	}
	return routing_table::need_bucket_split;
}